

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.capnp.h
# Opt level: O2

void __thiscall
capnp::compiler::Declaration::Field::DefaultValue::Builder::adoptValue
          (Builder *this,Orphan<capnp::compiler::Expression> *value)

{
  PointerBuilder local_18;
  
  *(undefined2 *)((long)(this->_builder).data + 0xc) = 1;
  local_18.pointer = (this->_builder).pointers + 6;
  local_18.segment = (this->_builder).segment;
  local_18.capTable = (this->_builder).capTable;
  _::PointerBuilder::adopt(&local_18,&value->builder);
  return;
}

Assistant:

inline void Declaration::Field::DefaultValue::Builder::adoptValue(
    ::capnp::Orphan< ::capnp::compiler::Expression>&& value) {
  _builder.setDataField<Declaration::Field::DefaultValue::Which>(
      ::capnp::bounded<6>() * ::capnp::ELEMENTS, Declaration::Field::DefaultValue::VALUE);
  ::capnp::_::PointerHelpers< ::capnp::compiler::Expression>::adopt(_builder.getPointerField(
      ::capnp::bounded<6>() * ::capnp::POINTERS), kj::mv(value));
}